

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexSetCookie(Fts5Index *p,int iNew)

{
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000014;
  Fts5Config *pConfig;
  int rc;
  sqlite3_blob *pBlob;
  sqlite3 *in_stack_00000038;
  u8 aCookie [4];
  sqlite3_blob **in_stack_00000200;
  undefined8 *z;
  sqlite3_blob *in_stack_ffffffffffffffc0;
  sqlite3_blob *pBlob_00;
  int local_28;
  undefined8 local_18;
  u8 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pBlob_00 = (sqlite3_blob *)*in_RDI;
  local_c[0] = 0xaa;
  local_c[1] = 0xaa;
  local_c[2] = 0xaa;
  local_c[3] = 0xaa;
  local_18 = 0;
  sqlite3Fts5Put32(local_c,in_ESI);
  z = &local_18;
  local_28 = sqlite3_blob_open(in_stack_00000038,(char *)pBlob,(char *)p,(char *)CONCAT44(iNew,rc),
                               (sqlite_int64)pConfig,in_stack_00000014,in_stack_00000200);
  if (local_28 == 0) {
    sqlite3_blob_write(in_stack_ffffffffffffffc0,z,0,0x26a4dd);
    local_28 = sqlite3_blob_close(pBlob_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5IndexSetCookie(Fts5Index *p, int iNew){
  int rc;                              /* Return code */
  Fts5Config *pConfig = p->pConfig;    /* Configuration object */
  u8 aCookie[4];                       /* Binary representation of iNew */
  sqlite3_blob *pBlob = 0;

  assert( p->rc==SQLITE_OK );
  sqlite3Fts5Put32(aCookie, iNew);

  rc = sqlite3_blob_open(pConfig->db, pConfig->zDb, p->zDataTbl,
      "block", FTS5_STRUCTURE_ROWID, 1, &pBlob
  );
  if( rc==SQLITE_OK ){
    sqlite3_blob_write(pBlob, aCookie, 4, 0);
    rc = sqlite3_blob_close(pBlob);
  }

  return rc;
}